

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O2

void __thiscall
QTriangulator<unsigned_short>::ComplexToSimple::fillPriorityQueue(ComplexToSimple *this)

{
  QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event> *this_00;
  int iVar1;
  int iVar2;
  Edge *pEVar3;
  QPodPoint *pQVar4;
  Event *pEVar5;
  int i;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  Event local_58;
  Event local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_events).siz = 0;
  this_00 = &this->m_events;
  QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::reserve
            (this_00,(this->m_edges).siz * 2);
  lVar7 = 0;
  for (lVar6 = 0; lVar6 < (this->m_edges).siz; lVar6 = lVar6 + 1) {
    pEVar3 = (this->m_edges).buffer;
    iVar1 = *(int *)((long)&pEVar3->to + lVar7);
    pQVar4 = (this->m_parent->m_vertices).buffer;
    iVar2 = *(int *)((long)&pEVar3->from + lVar7);
    if ((pQVar4[iVar1].x != pQVar4[iVar2].x) || (pQVar4[iVar1].y != pQVar4[iVar2].y)) {
      local_48.point =
           pQVar4[*(int *)((long)&pEVar3->from + (ulong)(&pEVar3->pointingUp)[lVar7] * 4 + lVar7)];
      local_58.point =
           pQVar4[*(int *)((long)&pEVar3->from +
                          (ulong)((&pEVar3->pointingUp)[lVar7] ^ 1) * 4 + lVar7)];
      local_48.type = Upper;
      local_58.edge = (int)lVar6;
      local_58.type = Lower;
      local_48.edge = local_58.edge;
      QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::add(this_00,&local_48);
      QDataBuffer<QTriangulator<unsigned_short>::ComplexToSimple::Event>::add(this_00,&local_58);
    }
    lVar7 = lVar7 + 0x20;
  }
  pEVar5 = (this->m_events).buffer;
  std::
  __sort<QTriangulator<unsigned_short>::ComplexToSimple::Event*,__gnu_cxx::__ops::_Iter_less_iter>
            (pEVar5,pEVar5 + (this->m_events).siz);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTriangulator<T>::ComplexToSimple::fillPriorityQueue()
{
    m_events.reset();
    m_events.reserve(m_edges.size() * 2);
    for (int i = 0; i < m_edges.size(); ++i) {
        Q_ASSERT(m_edges.at(i).previous == -1 && m_edges.at(i).next == -1);
        Q_ASSERT(m_edges.at(i).node == nullptr);
        Q_ASSERT(m_edges.at(i).pointingUp == m_edges.at(i).originallyPointingUp);
        Q_ASSERT(m_edges.at(i).pointingUp == (m_parent->m_vertices.at(m_edges.at(i).to) < m_parent->m_vertices.at(m_edges.at(i).from)));
        // Ignore zero-length edges.
        if (m_parent->m_vertices.at(m_edges.at(i).to) != m_parent->m_vertices.at(m_edges.at(i).from)) {
            QPodPoint upper = m_parent->m_vertices.at(m_edges.at(i).upper());
            QPodPoint lower = m_parent->m_vertices.at(m_edges.at(i).lower());
            Event upperEvent = {{upper.x, upper.y}, Event::Upper, i};
            Event lowerEvent = {{lower.x, lower.y}, Event::Lower, i};
            m_events.add(upperEvent);
            m_events.add(lowerEvent);
        }
    }

    std::sort(m_events.data(), m_events.data() + m_events.size());
}